

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetectorOutput.h
# Opt level: O3

void DetectorOutput::callback(Race *race,void *context)

{
  uintptr_t uVar1;
  uintptr_t uVar2;
  ostream *poVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  
  uVar1 = (race->first).stack_trace._M_elems[0];
  if ((callback::s1 != uVar1) &&
     (uVar2 = (race->second).stack_trace._M_elems[0], callback::s2 != uVar2)) {
    callback::s1 = uVar1;
    callback::s2 = uVar2;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"pc:   ",6);
    poVar3 = std::ostream::_M_insert<void_const*>(&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"addr: ",6);
    poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"rw:   ",6);
    uVar4 = (ulong)(race->first).write;
    pcVar6 = "read";
    pcVar5 = "read";
    if (uVar4 != 0) {
      pcVar5 = "write";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar5,uVar4 | 4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    uVar4 = (ulong)(race->second).write;
    if (uVar4 != 0) {
      pcVar6 = "write";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,uVar4 | 4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    poVar3 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"tid:  ",6);
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"race: ",6);
    callback::i = callback::i + 1;
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,callback::i);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    return;
  }
  return;
}

Assistant:

static void callback(const Detector::Race* race, void* context) {
    static uintptr_t s1 = 0, s2 = 0;
    if (s1 != race->first.stack_trace[0] && s2 != race->second.stack_trace[0]) {
      static int i = 0;
      s1 = race->first.stack_trace[0];
      s2 = race->second.stack_trace[0];
      std::cout << "pc:   " << (void*)(s1) << " " << (void*)(s2) << std::endl
                << "addr: " << (void*)(race->first.accessed_memory) << std::endl
                << "rw:   " << (race->first.write ? "write" : "read") << " "
                << (race->second.write ? "write" : "read") << std::endl
                << "tid:  " << std::hex << race->first.thread_id << " "
                << std::hex << race->second.thread_id << std::endl;
      std::cout << "race: " << ++i << "\n";
    }
  }